

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

Result __thiscall wabt::interp::Memory::Fill(Memory *this,u64 offset,u8 value,u64 size)

{
  pointer puVar1;
  ulong uVar2;
  Enum EVar3;
  
  puVar1 = (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = (long)(this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
  EVar3 = Error;
  if (((size + offset <= uVar2) && (size <= uVar2)) && (offset <= uVar2)) {
    EVar3 = Ok;
    if (size != 0) {
      memset(puVar1 + offset,(uint)value,size);
      EVar3 = Ok;
    }
  }
  return (Result)EVar3;
}

Assistant:

Result Memory::Fill(u64 offset, u8 value, u64 size) {
  if (IsValidAccess(offset, 0, size)) {
#if WABT_BIG_ENDIAN
    std::fill(data_.end() - offset - size, data_.end() - offset, value);
#else
    std::fill(data_.begin() + offset, data_.begin() + offset + size, value);
#endif
    return Result::Ok;
  }
  return Result::Error;
}